

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function_catalog_entry.cpp
# Opt level: O2

void __thiscall
duckdb::ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry
          (ScalarFunctionCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateScalarFunctionInfo *info)

{
  FunctionEntry::FunctionEntry
            (&this->super_FunctionEntry,SCALAR_FUNCTION_ENTRY,catalog,schema,
             &info->super_CreateFunctionInfo);
  (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__ScalarFunctionCatalogEntry_01799240;
  FunctionSet<duckdb::ScalarFunction>::FunctionSet
            (&(this->functions).super_FunctionSet<duckdb::ScalarFunction>,
             &(info->functions).super_FunctionSet<duckdb::ScalarFunction>);
  return;
}

Assistant:

ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema,
                                                       CreateScalarFunctionInfo &info)
    : FunctionEntry(CatalogType::SCALAR_FUNCTION_ENTRY, catalog, schema, info), functions(info.functions) {
}